

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  xpath_allocator *pxVar2;
  size_t sVar3;
  xpath_memory_block *pxVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int *piVar8;
  xml_attribute xVar9;
  byte *pbVar10;
  size_t sVar11;
  xml_attribute_struct *pxVar12;
  long lVar13;
  xpath_node *pxVar14;
  char *pcVar15;
  byte bVar16;
  byte bVar17;
  xpath_allocator *pxVar18;
  xpath_memory_block *pxVar19;
  xpath_ast_node *pxVar20;
  xpath_ast_node *this_00;
  xpath_ast_node *pxVar21;
  byte bVar22;
  char_t *pcVar23;
  less_equal *in_R8;
  xpath_memory_block *pxVar24;
  undefined1 uVar25;
  int *dst;
  undefined1 uVar26;
  xpath_node *pxVar27;
  double dVar28;
  double dVar29;
  double v;
  xml_attribute_struct *local_c8;
  size_t local_c0;
  xpath_node_set_raw local_a8;
  xpath_node_set_raw local_88;
  size_t local_68;
  xpath_string local_60;
  xpath_string local_48;
  
  uVar25 = xpath_type_none;
LAB_00367873:
  cVar5 = this->_type;
  uVar26 = xpath_type_node_set;
  switch(cVar5) {
  case '\x01':
    bVar6 = eval_boolean(this->_left,c,stack);
    lVar13 = 0x10;
    if (bVar6) goto switchD_003678c4_caseD_2f;
    break;
  case '\x02':
    bVar6 = eval_boolean(this->_left,c,stack);
    lVar13 = 0x10;
    if (!bVar6) goto switchD_003678c4_caseD_30;
    break;
  case '\x03':
    goto switchD_0036788a_caseD_3;
  case '\x04':
    pxVar20 = this->_left;
    this = this->_right;
    cVar5 = pxVar20->_rettype;
    cVar1 = this->_rettype;
    if ((cVar5 == '\x01') || (cVar1 == '\x01')) {
      if (cVar1 == '\x01' && cVar5 == '\x01') {
        pxVar18 = stack->result;
        pxVar24 = pxVar18->_root;
        sVar11 = pxVar18->_root_size;
        uVar26 = xpath_type_none;
        eval_node_set(&local_a8,pxVar20,c,stack,nodeset_eval_all);
        eval_node_set(&local_88,this,c,stack,nodeset_eval_all);
        local_c8 = (xml_attribute_struct *)local_a8._begin;
        pxVar12 = (xml_attribute_struct *)local_a8._end;
        pxVar14 = local_88._end;
        if (local_a8._begin != local_a8._end) {
          do {
            pxVar27 = local_88._begin;
            if (local_88._begin != pxVar14) {
              do {
                pxVar2 = stack->result;
                pxVar19 = pxVar2->_root;
                sVar3 = pxVar2->_root_size;
                string_value(&local_60,(anon_unknown_0 *)((xml_node *)&local_c8->header)->_root,
                             (xpath_node *)((xml_attribute *)&local_c8->name)->_attr,pxVar2);
                string_value(&local_48,(anon_unknown_0 *)(pxVar27->_node)._root,
                             (xpath_node *)(pxVar27->_attribute)._attr,stack->result);
                bVar6 = strequal(local_60._buffer,local_48._buffer);
                pxVar4 = pxVar2->_root;
                pxVar12 = (xml_attribute_struct *)local_a8._end;
                while (local_a8._end = (xpath_node *)pxVar12, pxVar4 != pxVar19) {
                  pxVar4 = pxVar4->next;
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            deallocate)();
                  pxVar12 = (xml_attribute_struct *)local_a8._end;
                }
                pxVar2->_root = pxVar19;
                pxVar2->_root_size = sVar3;
                if (!bVar6) {
                  uVar26 = xpath_type_node_set;
                  goto LAB_00368619;
                }
                pxVar14 = pxVar27 + 1;
                pxVar27 = pxVar14;
              } while (pxVar14 != local_88._end);
            }
            local_c8 = (xml_attribute_struct *)&local_c8->value;
          } while (local_c8 != pxVar12);
          uVar26 = xpath_type_none;
        }
LAB_00368619:
        pxVar19 = pxVar18->_root;
        while (pxVar19 != pxVar24) {
          pxVar19 = pxVar19->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
        pxVar18->_root = pxVar24;
        pxVar18->_root_size = sVar11;
        goto switchD_003678c4_caseD_2f;
      }
      pxVar21 = pxVar20;
      if (cVar5 == '\x01') {
        pxVar21 = this;
        cVar5 = cVar1;
        this = pxVar20;
      }
      if (cVar5 == '\x02') {
        pxVar18 = stack->result;
        pxVar24 = pxVar18->_root;
        local_68 = pxVar18->_root_size;
        dVar28 = eval_number(pxVar21,c,stack);
        uVar26 = false;
        eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
        pxVar12 = (xml_attribute_struct *)local_a8._begin;
        if (local_a8._begin != local_a8._end) {
          do {
            pxVar2 = stack->result;
            pxVar19 = pxVar2->_root;
            sVar11 = pxVar2->_root_size;
            string_value((xpath_string *)&local_88,
                         (anon_unknown_0 *)((xml_node *)&pxVar12->header)->_root,
                         (xpath_node *)((xml_attribute *)&pxVar12->name)->_attr,pxVar2);
            dVar29 = convert_string_to_number((char_t *)local_88._0_8_);
            pxVar4 = pxVar2->_root;
            while (pxVar4 != pxVar19) {
              pxVar4 = pxVar4->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            uVar26 = dVar28 != dVar29;
            pxVar2->_root = pxVar19;
            pxVar2->_root_size = sVar11;
          } while (((dVar28 == dVar29) && (!NAN(dVar28) && !NAN(dVar29))) &&
                  (pxVar12 = (xml_attribute_struct *)&pxVar12->value,
                  pxVar12 != (xml_attribute_struct *)local_a8._end));
        }
        pxVar19 = pxVar18->_root;
        while (pxVar19 != pxVar24) {
          pxVar19 = pxVar19->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
        goto LAB_0036832e;
      }
      if (cVar5 == '\x03') {
        pxVar18 = stack->result;
        pxVar24 = pxVar18->_root;
        local_c0 = pxVar18->_root_size;
        eval_string((xpath_string *)&local_88,pxVar21,c,stack);
        uVar26 = false;
        eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
        pxVar12 = (xml_attribute_struct *)local_a8._begin;
        if (local_a8._begin != local_a8._end) {
          do {
            pxVar2 = stack->result;
            pxVar19 = pxVar2->_root;
            sVar11 = pxVar2->_root_size;
            string_value(&local_60,(anon_unknown_0 *)((xml_node *)&pxVar12->header)->_root,
                         (xpath_node *)((xml_attribute *)&pxVar12->name)->_attr,pxVar2);
            bVar6 = strequal((char_t *)local_88._0_8_,local_60._buffer);
            pxVar4 = pxVar2->_root;
            while (pxVar4 != pxVar19) {
              pxVar4 = pxVar4->next;
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                        deallocate)();
            }
            pxVar2->_root = pxVar19;
            pxVar2->_root_size = sVar11;
            pxVar12 = (xml_attribute_struct *)&pxVar12->value;
          } while (bVar6 && pxVar12 != (xml_attribute_struct *)local_a8._end);
          uVar26 = !bVar6;
        }
        pxVar19 = pxVar18->_root;
        while (pxVar19 != pxVar24) {
          pxVar19 = pxVar19->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
        goto LAB_0036820e;
      }
      if (cVar5 != '\x04') goto LAB_003688c0;
      bVar6 = eval_boolean(pxVar21,c,stack);
      bVar7 = eval_boolean(this,c,stack);
      uVar25 = uVar25 ^ bVar7 != bVar6;
      goto LAB_00368388;
    }
    if (cVar5 == '\x04' || cVar1 == '\x04') goto code_r0x00367920;
    if (cVar5 == '\x02' || cVar1 == '\x02') {
      dVar28 = eval_number(pxVar20,c,stack);
      dVar29 = eval_number(this,c,stack);
      uVar26 = dVar29 != dVar28;
      goto switchD_003678c4_caseD_2f;
    }
    if (cVar5 == '\x03' || cVar1 == '\x03') {
      pxVar18 = stack->result;
      pxVar19 = pxVar18->_root;
      local_c8 = (xml_attribute_struct *)pxVar18->_root_size;
      eval_string((xpath_string *)&local_a8,pxVar20,c,stack);
      eval_string((xpath_string *)&local_88,this,c,stack);
      bVar6 = strequal((char_t *)local_a8._0_8_,(char_t *)local_88._0_8_);
      pxVar24 = pxVar18->_root;
      while (pxVar24 != pxVar19) {
        pxVar24 = pxVar24->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
      uVar26 = !bVar6;
      goto LAB_00367c53;
    }
LAB_003688c0:
    pcVar15 = 
    "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::not_equal_to]"
    ;
    goto LAB_003688b6;
  case '\x05':
    pxVar21 = this->_left;
    pxVar20 = this->_right;
    goto LAB_00367a81;
  case '\x06':
    pxVar20 = this->_left;
    pxVar21 = this->_right;
LAB_00367a81:
    uVar26 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                       (pxVar21,pxVar20,c,stack,(less *)in_R8);
    goto switchD_003678c4_caseD_2f;
  case '\a':
    pxVar21 = this->_left;
    pxVar20 = this->_right;
    goto LAB_00367a6a;
  case '\b':
    pxVar20 = this->_left;
    pxVar21 = this->_right;
LAB_00367a6a:
    uVar26 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                       (pxVar21,pxVar20,c,stack,in_R8);
    goto switchD_003678c4_caseD_2f;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_0036788a_caseD_9;
  case '\x14':
    cVar5 = this->_rettype;
    if (((this->_data).variable)->_type != (int)cVar5) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2969,
                    "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (cVar5 != '\x04') goto LAB_00367a09;
    uVar26 = (undefined1)(this->_data).variable[1]._type;
    goto switchD_003678c4_caseD_2f;
  default:
    lVar13 = 8;
    switch(cVar5) {
    case '\"':
      pxVar18 = stack->result;
      pxVar24 = pxVar18->_root;
      sVar11 = pxVar18->_root_size;
      eval_string((xpath_string *)&local_a8,this->_left,c,stack);
      eval_string((xpath_string *)&local_88,this->_right,c,stack);
      bVar16 = (byte)*(uintptr_t *)local_88._0_8_;
      if (bVar16 != 0) {
        lVar13 = 0;
        goto LAB_00367b98;
      }
      uVar26 = true;
      goto LAB_00367dfd;
    case '#':
      pxVar18 = stack->result;
      pxVar19 = pxVar18->_root;
      local_c8 = (xml_attribute_struct *)pxVar18->_root_size;
      eval_string((xpath_string *)&local_a8,this->_left,c,stack);
      eval_string((xpath_string *)&local_88,this->_right,c,stack);
      pcVar15 = strstr((char *)local_a8._0_8_,(char *)local_88._0_8_);
      uVar26 = pcVar15 != (char *)0x0;
      pxVar24 = pxVar18->_root;
      while (pxVar24 != pxVar19) {
        pxVar24 = pxVar24->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
      goto LAB_00367c53;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      goto switchD_0036788a_caseD_9;
    case '-':
      goto switchD_003678c4_caseD_2d;
    case '.':
      bVar6 = eval_boolean(this->_left,c,stack);
      goto LAB_00367abb;
    case '/':
      goto switchD_003678c4_caseD_2f;
    case '1':
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        pxVar18 = stack->result;
        pxVar24 = pxVar18->_root;
        sVar11 = pxVar18->_root_size;
        eval_string((xpath_string *)&local_a8,this->_left,c,stack);
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          local_60._buffer = (char_t *)(c->n)._node._root;
        }
        else {
          xml_node::xml_node((xml_node *)&local_88);
          local_60._buffer = (char_t *)local_88._0_8_;
        }
        if ((xml_node_struct *)local_60._buffer == (xml_node_struct *)0x0) goto LAB_00368013;
        goto LAB_00367fe4;
      }
    case '0':
switchD_003678c4_caseD_30:
      uVar26 = xpath_type_none;
      goto switchD_003678c4_caseD_2f;
    }
    if (cVar5 == ';') {
      dst = (int *)(this->_right->_data).string;
      if (this->_right->_type != '\x12') {
        if (*dst == 3) {
          piVar8 = *(int **)(dst + 4);
        }
        else {
          piVar8 = (int *)0x0;
        }
        dst = (int *)0x3fd4cd;
        if (piVar8 != (int *)0x0) {
          dst = piVar8;
        }
      }
      if ((c->n)._attribute._attr != (xml_attribute_struct *)0x0) {
        c = (xpath_context *)&local_a8;
        xml_node::xml_node((xml_node *)c);
      }
      local_a8._0_8_ = (c->n)._node;
      xVar9 = xml_node::attribute((xml_node *)&local_a8,(this->_left->_data).string);
      if (xVar9._attr != (xml_attribute_struct *)0x0) {
        pcVar23 = (xVar9._attr)->value;
        if (pcVar23 == (char_t *)0x0) {
          pcVar23 = "";
        }
        bVar6 = strequal(pcVar23,(char_t *)dst);
        if (bVar6) {
          pcVar15 = "";
          if ((xVar9._attr)->name != (char *)0x0) {
            pcVar15 = (xVar9._attr)->name;
          }
          cVar5 = 'x';
          lVar13 = 0;
          goto LAB_00367f55;
        }
      }
      uVar26 = xpath_type_none;
      goto switchD_003678c4_caseD_2f;
    }
switchD_0036788a_caseD_9:
    cVar5 = this->_rettype;
LAB_00367a09:
    if (cVar5 != '\x01') {
      if (cVar5 == '\x03') {
        pxVar18 = stack->result;
        pxVar19 = pxVar18->_root;
        local_c8 = (xml_attribute_struct *)pxVar18->_root_size;
        eval_string((xpath_string *)&local_a8,this,c,stack);
        uVar26 = *(byte *)local_a8._0_8_ != 0;
        pxVar24 = pxVar18->_root;
        while (pxVar24 != pxVar19) {
          pxVar24 = pxVar24->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
        goto LAB_00367c53;
      }
      if (cVar5 != '\x02') {
        __assert_fail("false && \"Wrong expression for return type boolean\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x298b,
                      "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                     );
      }
      dVar28 = eval_number(this,c,stack);
      if ((dVar28 == 0.0) && (!NAN(dVar28))) goto switchD_003678c4_caseD_30;
      uVar26 = xpath_type_node_set;
      goto switchD_003678c4_caseD_2f;
    }
    pxVar18 = stack->result;
    pxVar19 = pxVar18->_root;
    local_c8 = (xml_attribute_struct *)pxVar18->_root_size;
    eval_node_set(&local_a8,this,c,stack,nodeset_eval_any);
    uVar26 = local_a8._begin != local_a8._end;
    pxVar24 = pxVar18->_root;
    while (pxVar24 != pxVar19) {
      pxVar24 = pxVar24->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
LAB_00367c53:
    pxVar18->_root = pxVar19;
    pxVar18->_root_size = (size_t)local_c8;
    goto switchD_003678c4_caseD_2f;
  }
switchD_003678c4_caseD_2d:
  this = *(xpath_ast_node **)(&this->_type + lVar13);
  goto LAB_00367873;
  while( true ) {
    cVar5 = "xmlns"[lVar13 + 1];
    lVar13 = lVar13 + 1;
    if (lVar13 == 5) break;
LAB_00367f55:
    if (pcVar15[lVar13] != cVar5) goto switchD_003678c4_caseD_2f;
  }
  uVar26 = pcVar15[5] != ':' && pcVar15[5] != '\0';
  goto switchD_003678c4_caseD_2f;
  while( true ) {
    xml_node::xml_node((xml_node *)&local_88,*(xml_node_struct **)((long)pcVar23 + 0x18));
    local_60._buffer = (char_t *)local_88._0_8_;
    if ((xml_node_struct *)local_88._0_8_ == (xml_node_struct *)0x0) break;
LAB_00367fe4:
    pcVar23 = local_60._buffer;
    xVar9 = xml_node::attribute((xml_node *)&local_60,"xml:lang");
    if (xVar9._attr != (xml_attribute_struct *)0x0) {
      pbVar10 = (byte *)0x3fd4cd;
      if ((byte *)(xVar9._attr)->value != (byte *)0x0) {
        pbVar10 = (byte *)(xVar9._attr)->value;
      }
      bVar16 = *(byte *)local_a8._0_8_;
      if (bVar16 != 0) goto LAB_003680d7;
      goto LAB_00368348;
    }
  }
LAB_00368013:
  uVar26 = false;
  goto LAB_0036835d;
  while( true ) {
    pbVar10 = pbVar10 + 1;
    bVar16 = *(byte *)local_a8._0_8_;
    if (bVar16 == 0) break;
LAB_003680d7:
    local_a8._0_8_ = (long)&((xml_node_struct *)local_a8._0_8_)->header + 1;
    bVar17 = bVar16 | 0x20;
    if (0x19 < (int)(char)bVar16 - 0x41U) {
      bVar17 = bVar16;
    }
    bVar16 = *pbVar10;
    bVar22 = bVar16 | 0x20;
    if (0x19 < (int)(char)bVar16 - 0x41U) {
      bVar22 = bVar16;
    }
    if (bVar17 != bVar22) {
      uVar26 = false;
      goto LAB_0036835d;
    }
  }
LAB_00368348:
  uVar26 = *pbVar10 == 0x2d || *pbVar10 == 0;
LAB_0036835d:
  pxVar19 = pxVar18->_root;
  while (pxVar19 != pxVar24) {
    pxVar19 = pxVar19->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  pxVar18->_root = pxVar24;
LAB_00368380:
  pxVar18->_root_size = sVar11;
  goto switchD_003678c4_caseD_2f;
code_r0x00367920:
  bVar6 = eval_boolean(pxVar20,c,stack);
  uVar25 = uVar25 ^ bVar6;
  goto LAB_00367873;
switchD_0036788a_caseD_3:
  pxVar20 = this->_left;
  pxVar21 = this->_right;
  cVar5 = pxVar20->_rettype;
  cVar1 = pxVar21->_rettype;
  if (cVar1 != '\x01' && cVar5 != '\x01') {
    if (cVar1 == '\x04' || cVar5 == '\x04') {
      bVar6 = eval_boolean(pxVar20,c,stack);
      bVar7 = eval_boolean(pxVar21,c,stack);
      bVar6 = bVar7 != bVar6;
LAB_00367abb:
      uVar25 = uVar25 ^ bVar6 ^ xpath_type_node_set;
      goto LAB_00368388;
    }
    if (cVar5 != '\x02' && cVar1 != '\x02') {
      if (cVar5 != '\x03' && cVar1 != '\x03') {
LAB_003688a1:
        pcVar15 = 
        "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_eq(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::equal_to]"
        ;
LAB_003688b6:
        __assert_fail("false && \"Wrong types\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x265a,pcVar15);
      }
      pxVar18 = stack->result;
      pxVar19 = pxVar18->_root;
      local_c8 = (xml_attribute_struct *)pxVar18->_root_size;
      eval_string((xpath_string *)&local_a8,pxVar20,c,stack);
      eval_string((xpath_string *)&local_88,pxVar21,c,stack);
      uVar26 = strequal((char_t *)local_a8._0_8_,(char_t *)local_88._0_8_);
      pxVar24 = pxVar18->_root;
      while (pxVar24 != pxVar19) {
        pxVar24 = pxVar24->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
      goto LAB_00367c53;
    }
    dVar28 = eval_number(pxVar20,c,stack);
    dVar29 = eval_number(pxVar21,c,stack);
    uVar26 = dVar29 == dVar28;
    goto switchD_003678c4_caseD_2f;
  }
  if (cVar1 != '\x01' || cVar5 != '\x01') {
    this_00 = pxVar20;
    if (cVar5 == '\x01') {
      this_00 = pxVar21;
      cVar5 = cVar1;
      pxVar21 = pxVar20;
    }
    if (cVar5 == '\x02') {
      pxVar18 = stack->result;
      pxVar24 = pxVar18->_root;
      local_68 = pxVar18->_root_size;
      dVar28 = eval_number(this_00,c,stack);
      uVar26 = false;
      eval_node_set(&local_a8,pxVar21,c,stack,nodeset_eval_all);
      pxVar12 = (xml_attribute_struct *)local_a8._begin;
      if (local_a8._begin != local_a8._end) {
        do {
          pxVar2 = stack->result;
          pxVar19 = pxVar2->_root;
          sVar11 = pxVar2->_root_size;
          string_value((xpath_string *)&local_88,
                       (anon_unknown_0 *)((xml_node *)&pxVar12->header)->_root,
                       (xpath_node *)((xml_attribute *)&pxVar12->name)->_attr,pxVar2);
          dVar29 = convert_string_to_number((char_t *)local_88._0_8_);
          pxVar4 = pxVar2->_root;
          while (pxVar4 != pxVar19) {
            pxVar4 = pxVar4->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
          uVar26 = dVar28 == dVar29;
          pxVar2->_root = pxVar19;
          pxVar2->_root_size = sVar11;
        } while (((dVar28 != dVar29) || (NAN(dVar28) || NAN(dVar29))) &&
                (pxVar12 = (xml_attribute_struct *)&pxVar12->value,
                pxVar12 != (xml_attribute_struct *)local_a8._end));
      }
      pxVar19 = pxVar18->_root;
      while (pxVar19 != pxVar24) {
        pxVar19 = pxVar19->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
LAB_0036832e:
      pxVar18->_root = pxVar24;
      pxVar18->_root_size = local_68;
    }
    else {
      if (cVar5 != '\x03') {
        if (cVar5 != '\x04') goto LAB_003688a1;
        bVar6 = eval_boolean(this_00,c,stack);
        bVar7 = eval_boolean(pxVar21,c,stack);
        bVar6 = bVar7 != bVar6;
        goto LAB_00367abb;
      }
      pxVar18 = stack->result;
      pxVar24 = pxVar18->_root;
      local_c0 = pxVar18->_root_size;
      eval_string((xpath_string *)&local_88,this_00,c,stack);
      uVar26 = false;
      eval_node_set(&local_a8,pxVar21,c,stack,nodeset_eval_all);
      pxVar12 = (xml_attribute_struct *)local_a8._begin;
      if (local_a8._begin != local_a8._end) {
        do {
          pxVar2 = stack->result;
          pxVar19 = pxVar2->_root;
          sVar11 = pxVar2->_root_size;
          string_value(&local_60,(anon_unknown_0 *)((xml_node *)&pxVar12->header)->_root,
                       (xpath_node *)((xml_attribute *)&pxVar12->name)->_attr,pxVar2);
          uVar26 = strequal((char_t *)local_88._0_8_,local_60._buffer);
          pxVar4 = pxVar2->_root;
          while (pxVar4 != pxVar19) {
            pxVar4 = pxVar4->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
          pxVar2->_root = pxVar19;
          pxVar2->_root_size = sVar11;
          pxVar12 = (xml_attribute_struct *)&pxVar12->value;
        } while (pxVar12 != (xml_attribute_struct *)local_a8._end && !(bool)uVar26);
      }
      pxVar19 = pxVar18->_root;
      while (pxVar19 != pxVar24) {
        pxVar19 = pxVar19->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
LAB_0036820e:
      pxVar18->_root = pxVar24;
      pxVar18->_root_size = local_c0;
    }
    goto switchD_003678c4_caseD_2f;
  }
  pxVar18 = stack->result;
  pxVar24 = pxVar18->_root;
  sVar11 = pxVar18->_root_size;
  uVar26 = false;
  eval_node_set(&local_a8,pxVar20,c,stack,nodeset_eval_all);
  eval_node_set(&local_88,pxVar21,c,stack,nodeset_eval_all);
  local_c8 = (xml_attribute_struct *)local_a8._begin;
  pxVar12 = (xml_attribute_struct *)local_a8._end;
  pxVar14 = local_88._end;
  if (local_a8._begin != local_a8._end) {
    do {
      pxVar27 = local_88._begin;
      if (local_88._begin != pxVar14) {
        do {
          pxVar2 = stack->result;
          pxVar19 = pxVar2->_root;
          sVar3 = pxVar2->_root_size;
          string_value(&local_60,(anon_unknown_0 *)((xml_node *)&local_c8->header)->_root,
                       (xpath_node *)((xml_attribute *)&local_c8->name)->_attr,pxVar2);
          string_value(&local_48,(anon_unknown_0 *)(pxVar27->_node)._root,
                       (xpath_node *)(pxVar27->_attribute)._attr,stack->result);
          bVar6 = strequal(local_60._buffer,local_48._buffer);
          pxVar4 = pxVar2->_root;
          pxVar12 = (xml_attribute_struct *)local_a8._end;
          while (local_a8._end = (xpath_node *)pxVar12, pxVar4 != pxVar19) {
            pxVar4 = pxVar4->next;
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
            pxVar12 = (xml_attribute_struct *)local_a8._end;
          }
          pxVar2->_root = pxVar19;
          pxVar2->_root_size = sVar3;
          if (bVar6) {
            uVar26 = true;
            goto LAB_00367f93;
          }
          pxVar14 = pxVar27 + 1;
          pxVar27 = pxVar14;
        } while (pxVar14 != local_88._end);
      }
      local_c8 = (xml_attribute_struct *)&local_c8->value;
    } while (local_c8 != pxVar12);
    uVar26 = false;
  }
LAB_00367f93:
  pxVar19 = pxVar18->_root;
  while (pxVar19 != pxVar24) {
    pxVar19 = pxVar19->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  pxVar18->_root = pxVar24;
  goto LAB_00368380;
  while( true ) {
    bVar16 = *(byte *)((long)(uintptr_t *)local_88._0_8_ + lVar13 + 1);
    lVar13 = lVar13 + 1;
    if (bVar16 == 0) break;
LAB_00367b98:
    uVar26 = *(byte *)(local_a8._0_8_ + lVar13) == bVar16;
    if (!(bool)uVar26) break;
  }
LAB_00367dfd:
  pxVar19 = pxVar18->_root;
  while (pxVar19 != pxVar24) {
    pxVar19 = pxVar19->next;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
  }
  pxVar18->_root = pxVar24;
  pxVar18->_root_size = sVar11;
switchD_003678c4_caseD_2f:
  uVar25 = uVar25 ^ uVar26;
LAB_00368388:
  return (bool)(uVar25 & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != 0;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_number:
				return convert_number_to_boolean(eval_number(c, stack));

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_string(c, stack).empty();
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_node_set(c, stack, nodeset_eval_any).empty();
			}

			default:
				assert(false && "Wrong expression for return type boolean"); // unreachable
				return false;
			}
		}